

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

Expression * __thiscall wasm::Builder::makeConstantExpression(Builder *this,Literal *value)

{
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar1;
  bool bVar2;
  int32_t x;
  Shareability share;
  Const *pCVar3;
  HeapType HVar4;
  Expression *pEVar5;
  RefFunc *pRVar6;
  RefI31 *pRVar7;
  long lVar8;
  StringConst *pSVar9;
  uint uVar10;
  Literal *pLVar11;
  char *__assertion;
  size_t sVar12;
  long lVar13;
  Name func;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar14;
  HeapType local_240;
  stringstream wtf16;
  ostream local_230 [376];
  Literal local_b8;
  Literal local_a0;
  string_view local_88;
  undefined1 local_78 [8];
  value_type c;
  Type local_38;
  Type type;
  
  local_38.id = (value->type).id;
  if (local_38.id - 2 < 5) {
    wasm::Literal::Literal(&local_b8,value);
    pCVar3 = makeConst(this,&local_b8);
    pLVar11 = &local_b8;
LAB_00157a15:
    wasm::Literal::~Literal(pLVar11);
    return (Expression *)pCVar3;
  }
  bVar2 = Type::isNull(&value->type);
  if (bVar2) {
    HVar4 = Type::getHeapType(&local_38);
    pEVar5 = (Expression *)makeRefNull(this,HVar4);
    return pEVar5;
  }
  bVar2 = Type::isFunction(&local_38);
  if (bVar2) {
    func = Literal::getFunc(value);
    HVar4 = Type::getHeapType(&local_38);
    pRVar6 = makeRefFunc(this,func,HVar4);
    return (Expression *)pRVar6;
  }
  if ((local_38.id & 1) == 0 && 6 < local_38.id) {
    local_240 = Type::getHeapType(&local_38);
    bVar2 = HeapType::isMaybeShared(&local_240,i31);
    if (bVar2) {
      x = Literal::geti31(value,true);
      pCVar3 = makeConst<int>(this,x);
      local_240 = Type::getHeapType(&local_38);
      share = wasm::HeapType::getShared();
      pRVar7 = makeRefI31(this,(Expression *)pCVar3,share);
      return (Expression *)pRVar7;
    }
  }
  bVar2 = Type::isString(&local_38);
  if (bVar2) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_240);
    wasm::Literal::getGCData();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&c);
    IVar14 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
              )SmallVector<wasm::Literal,_1UL>::end
                         ((SmallVector<wasm::Literal,_1UL> *)((long)local_78 + 8));
    lVar13 = -0x18;
    sVar12 = 0;
    while( true ) {
      IVar1.index = sVar12;
      IVar1.parent = (SmallVector<wasm::Literal,_1UL> *)((long)local_78 + 8);
      if (IVar14 == IVar1) {
        std::__cxx11::stringbuf::str();
        IString::IString((IString *)&local_88,(string *)local_78);
        pSVar9 = makeStringConst(this,(Name)local_88);
        std::__cxx11::string::~string((string *)local_78);
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_240);
        return (Expression *)pSVar9;
      }
      pLVar11 = (Literal *)
                ((long)&((((Literals *)((long)local_78 + 8))->super_SmallVector<wasm::Literal,_1UL>)
                         .flexible.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
                         ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar13);
      if (sVar12 == 0) {
        pLVar11 = (((Literals *)((long)local_78 + 8))->super_SmallVector<wasm::Literal,_1UL>).fixed.
                  _M_elems;
      }
      wasm::Literal::Literal((Literal *)local_78,pLVar11);
      lVar8 = wasm::Literal::getInteger();
      if (0xffff < lVar8) break;
      std::operator<<(local_230,(char)lVar8);
      std::operator<<(local_230,(char)((ulong)lVar8 >> 8));
      wasm::Literal::~Literal((Literal *)local_78);
      sVar12 = sVar12 + 1;
      lVar13 = lVar13 + 0x18;
    }
    __assert_fail("u < 0x10000",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                  ,0x502,"Expression *wasm::Builder::makeConstantExpression(Literal)");
  }
  uVar10 = (uint)local_38.id & 1;
  if ((6 < local_38.id) && ((local_38.id & 1) == 0)) {
    local_240 = Type::getHeapType(&local_38);
    bVar2 = HeapType::isMaybeShared(&local_240,ext);
    if (bVar2) {
      wasm::Literal::internalize();
      pEVar5 = makeConstantExpression(this,&local_a0);
      pCVar3 = (Const *)makeRefAs(this,ExternConvertAny,pEVar5);
      pLVar11 = &local_a0;
      goto LAB_00157a15;
    }
    uVar10 = (uint)local_38.id & 1;
  }
  if (uVar10 == 0 || local_38.id < 7) {
    if (local_38.id < 7) {
      wasm::handle_unreachable
                ("unsupported constant expression",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                 ,0x50e);
    }
    __assertion = "type.isBasic() && \"TODO: handle compound types\"";
  }
  else {
    __assertion = "!type.isTuple() && \"Unexpected tuple type\"";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                ,0x50d,"Expression *wasm::Builder::makeConstantExpression(Literal)");
}

Assistant:

Expression* makeConstantExpression(Literal value) {
    auto type = value.type;
    if (type.isNumber()) {
      return makeConst(value);
    }
    if (value.isNull()) {
      return makeRefNull(type.getHeapType());
    }
    if (type.isFunction()) {
      return makeRefFunc(value.getFunc(), type.getHeapType());
    }
    if (type.isRef() && type.getHeapType().isMaybeShared(HeapType::i31)) {
      return makeRefI31(makeConst(value.geti31()),
                        type.getHeapType().getShared());
    }
    if (type.isString()) {
      // The string is already WTF-16, but we need to convert from `Literals` to
      // actual string.
      std::stringstream wtf16;
      for (auto c : value.getGCData()->values) {
        auto u = c.getInteger();
        assert(u < 0x10000);
        wtf16 << uint8_t(u & 0xFF);
        wtf16 << uint8_t(u >> 8);
      }
      // TODO: Use wtf16.view() once we have C++20.
      return makeStringConst(wtf16.str());
    }
    if (type.isRef() && type.getHeapType().isMaybeShared(HeapType::ext)) {
      return makeRefAs(ExternConvertAny,
                       makeConstantExpression(value.internalize()));
    }
    TODO_SINGLE_COMPOUND(type);
    WASM_UNREACHABLE("unsupported constant expression");
  }